

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONDebug.cpp
# Opt level: O2

void JSONDebug::_JSON_FAIL(json_string *msg)

{
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *p_Var1;
  
  p_Var1 = JSONSingleton<void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::get();
  if (p_Var1 != (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
                0x0) {
    (*p_Var1)(msg);
  }
  return;
}

Assistant:

void JSONDebug::_JSON_FAIL(const json_string & msg) json_nothrow {
    #ifdef JSON_STDERROR  //no callback, just use stderror
	   #ifndef JSON_UNICODE
		  std::cerr << msg << std::endl;
	   #else
		  std::cerr << std::string(msg.begin(), msg.end()) << std::endl;
	   #endif
    #else
	   if (json_error_callback_t ErrorCallback = JSONSingleton<json_error_callback_t>::get()){  //only do anything if the callback is registered
		  #ifdef JSON_LIBRARY
			 ErrorCallback(msg.c_str());
		  #else
			 ErrorCallback(msg);
		  #endif
	   }
    #endif
}